

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

int ll_insert_before(ll_head *q_head,ll_elem *n,ll_elem *rel,int wait)

{
  int iVar1;
  ll_head *plVar2;
  ll_elem *plVar3;
  ll_elem *local_50;
  ll_elem *p;
  ll_elem *s_;
  ll_elem *s;
  ll_elem *q;
  int wait_local;
  ll_elem *rel_local;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  plVar2 = (ll_head *)ptr_clear(&q_head->q);
  if (q_head != plVar2) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x3b6,
                  "int ll_insert_before(struct ll_head *, struct ll_elem *, struct ll_elem *, int)")
    ;
  }
  plVar3 = ptr_clear(n);
  if (n == plVar3) {
    plVar3 = ptr_clear(rel);
    if (rel != plVar3) {
      __assert_fail("rel == ptr_clear(rel)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x3b8,
                    "int ll_insert_before(struct ll_head *, struct ll_elem *, struct ll_elem *, int)"
                   );
    }
    if (wait == 0) {
      iVar1 = insert_lock(n);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      unlink_release(q_head,n,1);
    }
    deref_acquire(n,1);
    deref_acquire(rel,1);
    plVar3 = pred(q_head,rel);
    local_50 = ptr_clear(plVar3);
    s_ = rel;
    while (iVar1 = insert_between(q_head,n,local_50,s_), iVar1 == 0) {
      deref_release(q_head,local_50,1);
      iVar1 = deleted(s_);
      if (iVar1 != 0) {
        plVar3 = succ(q_head,s_);
        plVar3 = ptr_clear(plVar3);
        deref_release(q_head,s_,1);
        s_ = plVar3;
      }
      plVar3 = pred(q_head,s_);
      local_50 = ptr_clear(plVar3);
    }
    deref_release(q_head,local_50,1);
    deref_release(q_head,s_,1);
    deref_release(q_head,n,1);
    return 1;
  }
  __assert_fail("n == ptr_clear(n)",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x3b7,
                "int ll_insert_before(struct ll_head *, struct ll_elem *, struct ll_elem *, int)");
}

Assistant:

int
ll_insert_before(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *rel, int wait)
{
	struct ll_elem	*q, *s, *s_, *p;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(rel == ptr_clear(rel));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	/* This is insert_before, so rel is the successor. */
	s = rel;
	p = NULL;
	deref_acquire(s, 1);	/* Our local reference. */

	/* Lookup predecessor. */
	p = ptr_clear(pred(q_head, s));

	/*
	 * We now have:
	 * - p -- the predecessor of the insert position
	 * - s -- the successor of the insert position
	 * - n -- the node we need to insert between p and s
	 *
	 * Note that both p and s may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, p, s)) {
		/*
		 * Insert failed.
		 * This means at least one of p and s is no longer suitable.
		 * Forget p, fix s and re-resolve p.
		 */

		/* Forget p. */
		deref_release(q_head, p, 1);

		/* Fix s:
		 * if it is deleted, we need to insert before its successor.
		 */
		if (deleted(s)) {
			s_ = s;
			s = ptr_clear(succ(q_head, s));
			deref_release(q_head, s_, 1);
		}

		/* Find correct s. */
		p = ptr_clear(pred(q_head, s));
	}

	/*
	 * We have succesfully inserted n.
	 * Release our references on n, p and s.
	 */
	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, n, 1);
	return 1;
}